

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkle.cpp
# Opt level: O0

tuple<int,_int,_int>
libtorrent::merkle_find_known_subtree
          (span<const_libtorrent::digest32<256L>_> tree,int block_index,int num_valid_leafs)

{
  int iVar1;
  bool bVar2;
  index_type iVar3;
  int *piVar4;
  digest32<256L> *pdVar5;
  undefined4 in_register_00000014;
  _Tuple_impl<1UL,_int,_int> __args;
  int in_R8D;
  tuple<int,_int,_int> tVar7;
  int local_60;
  int local_48;
  int local_44;
  int local_40;
  int j;
  int first_check_index;
  int i;
  int root_index;
  int first_leaf;
  int leafs_size;
  int leafs_start;
  int num_valid_leafs_local;
  int block_index_local;
  span<const_libtorrent::digest32<256L>_> tree_local;
  _Head_base<0UL,_int,_false> _Var6;
  
  tree_local.m_ptr = (digest32<256L> *)CONCAT44(in_register_00000014,block_index);
  _num_valid_leafs_local = (digest32<256L> *)tree.m_len;
  __args = (_Tuple_impl<1UL,_int,_int>)tree.m_ptr;
  root_index = 1;
  first_leaf = num_valid_leafs;
  leafs_size = in_R8D;
  leafs_start = num_valid_leafs;
  tree_local.m_len = (difference_type)__args;
  iVar3 = span<const_libtorrent::digest32<256L>_>::size
                    ((span<const_libtorrent::digest32<256L>_> *)&num_valid_leafs_local);
  i = (int)(iVar3 / 2);
  first_check_index = merkle_get_sibling(i + leafs_start);
  j = leafs_start;
  while( true ) {
    if ((j & 1U) == 0) {
      local_60 = root_index;
    }
    else {
      local_60 = -root_index;
    }
    local_40 = first_leaf + local_60;
    local_44 = 0;
    while( true ) {
      iVar1 = local_44;
      local_48 = leafs_size - local_40;
      piVar4 = ::std::min<int>(&root_index,&local_48);
      if (*piVar4 <= iVar1) break;
      pdVar5 = span<const_libtorrent::digest32<256L>_>::operator[]
                         ((span<const_libtorrent::digest32<256L>_> *)&num_valid_leafs_local,
                          (long)(i + local_40 + local_44));
      bVar2 = digest32<256L>::is_all_zeros(pdVar5);
      if (bVar2) {
        tVar7 = ::std::make_tuple<int&,int&,int&>((int *)__args,&first_leaf,&root_index);
        _Var6 = tVar7.super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>.
                _M_head_impl;
        goto LAB_003f6fb0;
      }
      local_44 = local_44 + 1;
    }
    if ((j & 1U) != 0) {
      first_leaf = first_leaf - root_index;
    }
    root_index = root_index << 1;
    first_check_index = merkle_get_parent(first_check_index);
    pdVar5 = span<const_libtorrent::digest32<256L>_>::operator[]
                       ((span<const_libtorrent::digest32<256L>_> *)&num_valid_leafs_local,
                        (long)first_check_index);
    bVar2 = digest32<256L>::is_all_zeros(pdVar5);
    if (!bVar2) break;
    j = j >> 1;
  }
  tVar7 = ::std::make_tuple<int&,int&,int&>((int *)__args,&first_leaf,&root_index);
  _Var6 = tVar7.super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>._M_head_impl
  ;
LAB_003f6fb0:
  tVar7.super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>._M_head_impl =
       _Var6._M_head_impl;
  tVar7.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int> = __args;
  return (tuple<int,_int,_int>)tVar7.super__Tuple_impl<0UL,_int,_int,_int>;
}

Assistant:

std::tuple<int, int, int> merkle_find_known_subtree(span<sha256_hash const> const tree
		, int const block_index, int const num_valid_leafs)
	{
		// find the largest block of leafs from a single subtree we know the hashes of
		int leafs_start = block_index;
		int leafs_size = 1;
		int const first_leaf = int(tree.size() / 2);
		int root_index = merkle_get_sibling(first_leaf + block_index);
		for (int i = block_index;; i >>= 1)
		{
			int const first_check_index = leafs_start + ((i & 1) ? -leafs_size : leafs_size);
			for (int j = 0; j < std::min(leafs_size, num_valid_leafs - first_check_index); ++j)
			{
				if (tree[first_leaf + first_check_index + j].is_all_zeros())
					return std::make_tuple(leafs_start, leafs_size, root_index);
			}
			if (i & 1) leafs_start -= leafs_size;
			leafs_size *= 2;
			root_index = merkle_get_parent(root_index);
			// if an inner node is known then its parent must be known too
			// so if the root is known the next sibling subtree should already
			// be computed if all of its leafs have valid hashes
			if (!tree[root_index].is_all_zeros()) break;
			TORRENT_ASSERT(root_index != 0);
			TORRENT_ASSERT(leafs_start >= 0);
			TORRENT_ASSERT(leafs_size <= merkle_num_leafs(num_valid_leafs));
		}

		TORRENT_ASSERT(leafs_start >= 0);
		TORRENT_ASSERT(leafs_start < merkle_num_leafs(num_valid_leafs));
		TORRENT_ASSERT(leafs_start + leafs_size > block_index);

		return std::make_tuple(leafs_start, leafs_size, root_index);
	}